

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrUtil.c
# Opt level: O2

void Rwr_ManLoadFromFile(Rwr_Man_t *p,char *pFileName)

{
  uint uVar1;
  uint uVar2;
  void **ppvVar3;
  Rwr_Node_t *p0;
  Rwr_Node_t *p1;
  uint uVar4;
  int iVar5;
  abctime aVar6;
  FILE *__stream;
  void *__ptr;
  ulong uVar7;
  abctime aVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  int nEntries;
  
  aVar6 = Abc_Clock();
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    printf("Rwr_ManLoadFromFile: Cannot open file \"%s\".\n",pFileName);
    return;
  }
  fread(&nEntries,4,1,__stream);
  lVar10 = (long)nEntries;
  __ptr = malloc(lVar10 << 3);
  fread(__ptr,4,lVar10 * 2,__stream);
  fclose(__stream);
  uVar7 = 0;
  uVar9 = 0;
  if (0 < nEntries) {
    uVar9 = (ulong)(uint)nEntries;
  }
  for (; uVar9 != uVar7; uVar7 = uVar7 + 1) {
    uVar1 = *(uint *)((long)__ptr + uVar7 * 8);
    uVar2 = *(uint *)((long)__ptr + uVar7 * 8 + 4);
    *(uint *)((long)__ptr + uVar7 * 8) = uVar1 >> 1;
    ppvVar3 = p->vForest->pArray;
    p0 = (Rwr_Node_t *)ppvVar3[uVar1 >> 2];
    p1 = (Rwr_Node_t *)ppvVar3[uVar2 >> 1];
    uVar4 = (byte)p0->field_0x11 & 0x3f;
    uVar11 = (byte)p1->field_0x11 & 0x3f;
    if (uVar11 < uVar4) {
      uVar11 = uVar4;
    }
    iVar5 = Rwr_ManNodeVolume(p,p0,p1);
    Rwr_ManAddNode(p,(Rwr_Node_t *)((ulong)(uVar1 >> 1 & 1) ^ (ulong)p0),
                   (Rwr_Node_t *)((ulong)(uVar2 & 1) ^ (ulong)p1),uVar1 & 1,uVar11 + 1,
                   iVar5 + (uVar1 & 1) + 1);
  }
  free(__ptr);
  printf("The number of classes = %d. Canonical nodes = %d.\n",(ulong)(uint)p->nClasses,
         (ulong)(uint)p->nAdded);
  iVar5 = 0x748332;
  printf("The number of nodes loaded = %d.   ",lVar10);
  Abc_Print(iVar5,"%s =","Loading");
  aVar8 = Abc_Clock();
  Abc_Print(iVar5,"%9.2f sec\n",(double)(aVar8 - aVar6) / 1000000.0);
  return;
}

Assistant:

void Rwr_ManLoadFromFile( Rwr_Man_t * p, char * pFileName )
{
    FILE * pFile;
    Rwr_Node_t * p0, * p1;
    unsigned * pBuffer;
    int Level, Volume, nEntries, fExor;
    int i;
    abctime clk = Abc_Clock();
    int RetValue;

    // load the data
    pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Rwr_ManLoadFromFile: Cannot open file \"%s\".\n", pFileName );
        return;
    }
    RetValue = fread( &nEntries, sizeof(int), 1, pFile );
    pBuffer = ABC_ALLOC( unsigned, nEntries * 2 );
    RetValue = fread( pBuffer, sizeof(unsigned), nEntries * 2, pFile );
    fclose( pFile );
    // reconstruct the forest
    for ( i = 0; i < nEntries; i++ )
    {
        // get EXOR flag
        fExor = (pBuffer[2*i + 0] & 1);
        pBuffer[2*i + 0] = (pBuffer[2*i + 0] >> 1);
        // get the nodes
        p0 = (Rwr_Node_t *)p->vForest->pArray[pBuffer[2*i + 0] >> 1];
        p1 = (Rwr_Node_t *)p->vForest->pArray[pBuffer[2*i + 1] >> 1];
        // compute the level and volume of the new nodes
        Level  = 1 + Abc_MaxInt( p0->Level, p1->Level );
        Volume = 1 + Rwr_ManNodeVolume( p, p0, p1 );
        // set the complemented attributes
        p0 = Rwr_NotCond( p0, (pBuffer[2*i + 0] & 1) );
        p1 = Rwr_NotCond( p1, (pBuffer[2*i + 1] & 1) );
        // add the node
//        Rwr_ManTryNode( p, p0, p1, Level, Volume );
        Rwr_ManAddNode( p, p0, p1, fExor, Level, Volume + fExor );
    }
    ABC_FREE( pBuffer );
    printf( "The number of classes = %d. Canonical nodes = %d.\n", p->nClasses, p->nAdded );
    printf( "The number of nodes loaded = %d.   ", nEntries );  ABC_PRT( "Loading", Abc_Clock() - clk );
}